

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodeCustomLinSolver.cpp
# Opt level: O3

int pele::physics::reactions::cvode::SUNLinSolSolve_Sparse_custom
              (SUNLinearSolver S,SUNMatrix a_A,N_Vector x,N_Vector b,Real param_5)

{
  int iVar1;
  
  N_VGetArrayPointer(x);
  N_VGetArrayPointer(b);
  SUNSparseMatrix_Data(a_A);
  if (0 < *(int *)((long)S->content + 8)) {
    iVar1 = 0;
    do {
      amrex::Abort_host("sgjsolve not implemented, choose a different solver ");
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)((long)S->content + 8));
  }
  return 0;
}

Assistant:

int
SUNLinSolSolve_Sparse_custom(
  SUNLinearSolver S, SUNMatrix a_A, N_Vector x, N_Vector b, amrex::Real /*tol*/)
{
  BL_PROFILE("Pele::GaussSolver()");
  amrex::Real* x_d = N_VGetArrayPointer(x);
  amrex::Real* b_d = N_VGetArrayPointer(b);

  auto* Data = static_cast<amrex::Real*>(SUNSparseMatrix_Data(a_A));

  for (int tid = 0; tid < SUN_CUSP_NUM_SUBSYS(S); tid++) {
    int offset = tid * SUN_CUSP_SUBSYS_NNZ(S);
    int offset_RHS = tid * SUN_CUSP_SUBSYS_SIZE(S);
    amrex::Real* Data_offset = Data + offset;
    amrex::Real* x_d_offset = x_d + offset_RHS;
    amrex::Real* b_d_offset = b_d + offset_RHS;
    sgjsolve(Data_offset, x_d_offset, b_d_offset);
  }

  return (SUNLS_SUCCESS);
}